

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O2

QList<QLoggingRule> *
loadRulesFromFile(QList<QLoggingRule> *__return_storage_ptr__,QString *filePath)

{
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  int __oflag;
  char *pcVar4;
  long in_FS_OFFSET;
  QMessageLogger local_98;
  QTextStream local_78;
  QFile local_68;
  QArrayDataPointer<QLoggingRule> local_58;
  QLoggingSettingsParser local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = qtLoggingDebug();
  if (bVar2) {
    local_40.m_inRulesSection = true;
    local_40._1_3_ = 0;
    local_40._rules.d.ptr._4_4_ = 0;
    local_40._4_4_ = 0;
    local_40._rules.d.d._0_4_ = 0;
    local_40._rules.d.d._4_4_ = 0;
    local_40._rules.d.ptr._0_4_ = 0;
    local_40._rules.d.size = 0x466c63;
    QDir::toNativeSeparators((QString *)&local_58,filePath);
    QString::toUtf8_helper((QByteArray *)&local_98,(QString *)&local_58);
    pcVar4 = (char *)CONCAT44(local_98.context.file._4_4_,local_98.context.file._0_4_);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = &QByteArray::_empty;
    }
    QMessageLogger::debug((QMessageLogger *)&local_40,"Checking \"%s\" for rules",pcVar4);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  local_68.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_68.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_68,filePath);
  iVar3 = QFile::open(&local_68,(char *)0x11,__oflag);
  if ((char)iVar3 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QLoggingRule *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_78._vptr_QTextStream = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d_ptr._M_t.
    super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
    super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
         (__uniq_ptr_data<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>,_true,_true>)
         &DAT_aaaaaaaaaaaaaaaa;
    QTextStream::QTextStream(&local_78,(QIODevice *)&local_68);
    local_40._4_4_ = 0xaaaaaaaa;
    local_40.m_inRulesSection = false;
    local_40._1_3_ = 0xaaaaaa;
    local_40._rules.d.d._0_4_ = 0;
    local_40._rules.d.d._4_4_ = 0;
    local_40._rules.d.ptr._0_4_ = 0;
    local_40._rules.d.ptr._4_4_ = 0;
    local_40._rules.d.size = 0;
    QLoggingSettingsParser::setContent(&local_40,&local_78);
    bVar2 = qtLoggingDebug();
    if (bVar2) {
      local_98.context.version = 2;
      local_98.context.line = 0;
      local_98.context.file._0_4_ = 0;
      local_98.context.file._4_4_ = 0;
      local_98.context.function._0_4_ = 0;
      local_98.context.function._4_4_ = 0;
      local_98.context.category = "qt.core.logging";
      local_58.d = (Data *)CONCAT44(local_40._rules.d.d._4_4_,local_40._rules.d.d._0_4_);
      local_58.ptr = (QLoggingRule *)
                     CONCAT44(local_40._rules.d.ptr._4_4_,local_40._rules.d.ptr._0_4_);
      local_58.size = local_40._rules.d.size;
      if (local_58.d != (Data *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QMessageLogger::debug(&local_98,"Loaded %td rules",local_40._rules.d.size);
      QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_58);
    }
    pDVar1 = (Data *)CONCAT44(local_40._rules.d.d._4_4_,local_40._rules.d.d._0_4_);
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr =
         (QLoggingRule *)CONCAT44(local_40._rules.d.ptr._4_4_,local_40._rules.d.ptr._0_4_);
    (__return_storage_ptr__->d).size = local_40._rules.d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_40._rules.d);
    QTextStream::~QTextStream(&local_78);
  }
  QFile::~QFile(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QList<QLoggingRule> loadRulesFromFile(const QString &filePath)
{
    if (qtLoggingDebug()) {
        debugMsg("Checking \"%s\" for rules",
                 QDir::toNativeSeparators(filePath).toUtf8().constData());
    }

    QFile file(filePath);
    if (file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        QTextStream stream(&file);
        QLoggingSettingsParser parser;
        parser.setContent(stream);
        if (qtLoggingDebug())
            debugMsg("Loaded %td rules", static_cast<ptrdiff_t>(parser.rules().size()));
        return parser.rules();
    }
    return QList<QLoggingRule>();
}